

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::move_backward
          (InnerLeaf<1> *this,int *first,int *last)

{
  long lVar1;
  difference_type __d;
  long lVar2;
  double *pdVar3;
  
  lVar2 = (long)*last;
  if (*first < lVar2) {
    lVar1 = (lVar2 - *first) + 1;
    pdVar3 = &(this->entries)._M_elems[lVar2].value_;
    do {
      ((HighsHashTableEntry<std::pair<int,_int>,_double> *)(pdVar3 + -1))->key_ =
           *(pair<int,_int> *)(pdVar3 + -3);
      *pdVar3 = pdVar3[-2];
      pdVar3 = pdVar3 + -2;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  lVar2 = (long)*first;
  memmove((this->hashes)._M_elems + lVar2 + 1,(this->hashes)._M_elems + lVar2,(*last - lVar2) * 8);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }